

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_buffer_send
                   (Curl_send_buffer *in,connectdata *conn,long *bytes_written,
                   size_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd_00;
  void *pvVar1;
  ulong uVar2;
  SessionHandle *pSVar3;
  CURLcode CVar4;
  size_t size_00;
  size_t local_98;
  size_t local_90;
  size_t bodylen;
  size_t headlen;
  size_t headersize;
  size_t sStack_68;
  curl_socket_t sockfd;
  size_t sendsize;
  HTTP *http;
  size_t size;
  char *ptr;
  ulong uStack_40;
  CURLcode res;
  ssize_t amount;
  size_t sStack_30;
  int socketindex_local;
  size_t included_body_bytes_local;
  long *bytes_written_local;
  connectdata *conn_local;
  Curl_send_buffer *in_local;
  
  pvVar1 = (conn->data->req).protop;
  sockfd_00 = conn->sock[socketindex];
  size = (size_t)in->buffer;
  uVar2 = in->size_used;
  local_98 = uVar2 - included_body_bytes;
  sStack_68 = uVar2;
  amount._4_4_ = socketindex;
  sStack_30 = included_body_bytes;
  included_body_bytes_local = (size_t)bytes_written;
  bytes_written_local = (long *)conn;
  conn_local = (connectdata *)in;
  if ((conn->handler->flags & 1) != 0) {
    local_90 = uVar2;
    if (0x4000 < uVar2) {
      local_90 = 0x4000;
    }
    sStack_68 = local_90;
    memcpy((conn->data->state).uploadbuffer,(void *)size,local_90);
    size = *bytes_written_local + 0x4881;
  }
  CVar4 = Curl_write((connectdata *)bytes_written_local,sockfd_00,(void *)size,sStack_68,
                     (ssize_t *)&stack0xffffffffffffffc0);
  if (CVar4 == CURLE_OK) {
    if (uStack_40 <= local_98) {
      local_98 = uStack_40;
    }
    size_00 = uStack_40 - local_98;
    if (((*(byte *)(*bytes_written_local + 0x498) & 1) != 0) &&
       (Curl_debug((SessionHandle *)*bytes_written_local,CURLINFO_HEADER_OUT,(char *)size,local_98,
                   (connectdata *)bytes_written_local), size_00 != 0)) {
      Curl_debug((SessionHandle *)*bytes_written_local,CURLINFO_DATA_OUT,(char *)(size + local_98),
                 size_00,(connectdata *)bytes_written_local);
    }
    if (size_00 != 0) {
      *(size_t *)((long)pvVar1 + 0x30) = size_00 + *(long *)((long)pvVar1 + 0x30);
    }
    *(ulong *)included_body_bytes_local = uStack_40 + *(long *)included_body_bytes_local;
    if (pvVar1 == (void *)0x0) {
      if (uStack_40 != uVar2) {
        return CURLE_SEND_ERROR;
      }
      *(undefined1 *)((long)bytes_written_local + 0x33d) = 0;
    }
    else {
      if (uStack_40 != uVar2) {
        pSVar3 = conn_local->data;
        *(long *)((long)pvVar1 + 0x58) = bytes_written_local[0x6f];
        *(long *)((long)pvVar1 + 0x60) = bytes_written_local[0x70];
        *(undefined8 *)((long)pvVar1 + 0x68) = *(undefined8 *)((long)pvVar1 + 0x10);
        *(undefined8 *)((long)pvVar1 + 0x70) = *(undefined8 *)((long)pvVar1 + 8);
        bytes_written_local[0x6f] = (long)readmoredata;
        bytes_written_local[0x70] = (long)bytes_written_local;
        *(ulong *)((long)pvVar1 + 0x10) = (long)pSVar3->sockets + (uStack_40 - 0x38);
        *(ulong *)((long)pvVar1 + 8) = uVar2 - uStack_40;
        *(connectdata **)((long)pvVar1 + 0x80) = conn_local;
        *(undefined4 *)((long)pvVar1 + 0x78) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)((long)pvVar1 + 0x78) = 2;
    }
  }
  if (conn_local->data != (SessionHandle *)0x0) {
    (*Curl_cfree)(conn_local->data);
  }
  (*Curl_cfree)(conn_local);
  return CVar4;
}

Assistant:

CURLcode Curl_add_buffer_send(Curl_send_buffer *in,
                              struct connectdata *conn,

                               /* add the number of sent bytes to this
                                  counter */
                              long *bytes_written,

                               /* how much of the buffer contains body data */
                              size_t included_body_bytes,
                              int socketindex)

{
  ssize_t amount;
  CURLcode res;
  char *ptr;
  size_t size;
  struct HTTP *http = conn->data->req.protop;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = in->buffer;
  size = in->size_used;

  headersize = size - included_body_bytes; /* the initial part that isn't body
                                              is header */

  DEBUGASSERT(size > included_body_bytes);

  res = Curl_convert_to_network(conn->data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(res) {
    /* conversion failed, free memory and return to the caller */
    if(in->buffer)
      free(in->buffer);
    free(in);
    return res;
  }


  if(conn->handler->flags & PROTOPT_SSL) {
    /* We never send more than CURL_MAX_WRITE_SIZE bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */

    sendsize= (size > CURL_MAX_WRITE_SIZE)?CURL_MAX_WRITE_SIZE:size;

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    memcpy(conn->data->state.uploadbuffer, ptr, sendsize);
    ptr = conn->data->state.uploadbuffer;
  }
  else
    sendsize = size;

  res = Curl_write(conn, sockfd, ptr, sendsize, &amount);

  if(CURLE_OK == res) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize?headersize:(size_t)amount;
    size_t bodylen = amount - headlen;

    if(conn->data->set.verbose) {
      /* this data _may_ contain binary stuff */
      Curl_debug(conn->data, CURLINFO_HEADER_OUT, ptr, headlen, conn);
      if(bodylen) {
        /* there was body data sent beyond the initial header part, pass that
           on to the debug callback too */
        Curl_debug(conn->data, CURLINFO_DATA_OUT,
                   ptr+headlen, bodylen, conn);
      }
    }
    if(bodylen)
      /* since we sent a piece of the body here, up the byte counter for it
         accordingly */
      http->writebytecount += bodylen;

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = in->buffer + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = conn->fread_func;
        http->backup.fread_in = conn->fread_in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        conn->fread_func = (curl_read_callback)readmoredata;
        conn->fread_in = (void *)conn;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        http->send_buffer = in;
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
      else
        conn->writechannel_inuse = FALSE;
    }
  }
  if(in->buffer)
    free(in->buffer);
  free(in);

  return res;
}